

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# named_fstream.cc
# Opt level: O0

void __thiscall named_fstream::~named_fstream(named_fstream *this)

{
  void **in_RDI;
  named_fstream *unaff_retaddr;
  
  ~named_fstream(unaff_retaddr,in_RDI);
  std::ios::~ios((ios *)(in_RDI + 0x28));
  return;
}

Assistant:

named_fstream::~named_fstream() {
    remove(file_name.data());
}